

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O0

uint32 dumbfile_cgetul(DUMBFILE *f)

{
  int v;
  uint32 rv;
  uint in_stack_ffffffffffffffe8;
  uint uVar1;
  
  uVar1 = 0;
  do {
    in_stack_ffffffffffffffe8 = dumbfile_getc((DUMBFILE *)CONCAT44(uVar1,in_stack_ffffffffffffffe8))
    ;
    if ((int)in_stack_ffffffffffffffe8 < 0) {
      return in_stack_ffffffffffffffe8;
    }
    uVar1 = in_stack_ffffffffffffffe8 & 0x7f | uVar1 << 7;
  } while ((in_stack_ffffffffffffffe8 & 0x80) != 0);
  return uVar1;
}

Assistant:

uint32 DUMBEXPORT dumbfile_cgetul(DUMBFILE *f)
{
	uint32 rv = 0;
	int v;

	do {
		v = dumbfile_getc(f);

		if (v < 0)
			return v;

		rv <<= 7;
		rv |= v & 0x7F;
	} while (v & 0x80);

	return rv;
}